

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::Initialize(RowGroupCollection *this,PersistentCollectionData *data)

{
  pointer pPVar1;
  RowGroupSegmentTree *pRVar2;
  pointer pRVar3;
  pointer args_1;
  templated_unique_single_t row_group;
  SegmentLock l;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_58;
  __uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> local_50;
  TableStatistics *local_48;
  unique_lock<std::mutex> local_40;
  
  local_48 = &this->stats;
  TableStatistics::InitializeEmpty(local_48,&this->types);
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  ::std::unique_lock<std::mutex>::unique_lock
            (&local_40,&(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  pPVar1 = (data->row_group_data).
           super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           .
           super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (args_1 = (data->row_group_data).
                super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                .
                super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                ._M_impl.super__Vector_impl_data._M_start; args_1 != pPVar1; args_1 = args_1 + 1) {
    make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,duckdb::PersistentRowGroupData&>
              ((duckdb *)&local_58,this,args_1);
    pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *
                        )&local_58);
    RowGroup::MergeIntoStatistics(pRVar3,local_48);
    pRVar3 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                       ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *
                        )&local_58);
    LOCK();
    (this->total_rows).super___atomic_base<unsigned_long>._M_i =
         (this->total_rows).super___atomic_base<unsigned_long>._M_i +
         (pRVar3->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i
    ;
    UNLOCK();
    pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    local_50._M_t.super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>
    .super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl =
         (tuple<duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)
         (tuple<duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)local_58._M_head_impl;
    local_58._M_head_impl = (RowGroup *)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&pRVar2->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_40,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_50);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_50);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_58);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void RowGroupCollection::Initialize(PersistentCollectionData &data) {
	stats.InitializeEmpty(types);
	auto l = row_groups->Lock();
	for (auto &row_group_data : data.row_group_data) {
		auto row_group = make_uniq<RowGroup>(*this, row_group_data);
		row_group->MergeIntoStatistics(stats);
		total_rows += row_group->count;
		row_groups->AppendSegment(l, std::move(row_group));
	}
}